

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindOperation.cpp
# Opt level: O0

CK_ULONG __thiscall
FindOperation::retrieveHandles(FindOperation *this,CK_OBJECT_HANDLE_PTR phObject,CK_ULONG ulCount)

{
  bool bVar1;
  reference puVar2;
  ulong in_RDX;
  long in_RSI;
  _Rb_tree_const_iterator<unsigned_long> *in_RDI;
  const_iterator it;
  CK_ULONG ulReturn;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_ffffffffffffffb8;
  _Self local_38;
  _Base_ptr local_30;
  _Rb_tree_const_iterator<unsigned_long> local_28;
  ulong local_20;
  ulong local_18;
  long local_10;
  
  local_20 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::_Rb_tree_const_iterator<unsigned_long>::_Rb_tree_const_iterator(&local_28);
  local_30 = (_Base_ptr)
             std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
             begin(in_stack_ffffffffffffffb8);
  local_28._M_node = local_30;
  while( true ) {
    local_38._M_node =
         (_Base_ptr)
         std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
                   (in_stack_ffffffffffffffb8);
    bVar1 = std::operator!=(&local_28,&local_38);
    if ((!bVar1) || (local_18 <= local_20)) break;
    puVar2 = std::_Rb_tree_const_iterator<unsigned_long>::operator*(in_RDI);
    *(unsigned_long *)(local_10 + local_20 * 8) = *puVar2;
    local_20 = local_20 + 1;
    std::_Rb_tree_const_iterator<unsigned_long>::operator++(in_RDI);
  }
  return local_20;
}

Assistant:

CK_ULONG FindOperation::retrieveHandles(CK_OBJECT_HANDLE_PTR phObject, CK_ULONG ulCount)
{
    CK_ULONG ulReturn = 0;
    std::set<CK_OBJECT_HANDLE>::const_iterator it;
    for (it=_handles.begin(); it != _handles.end(); ++it) {
        if (ulReturn >= ulCount) break;

        phObject[ulReturn++] = *it;
    }
    return ulReturn;
}